

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo>::
emplaceValue<QRestAccessManagerPrivate::CallerInfo_const&>
          (Node<QNetworkReply*,QRestAccessManagerPrivate::CallerInfo> *this,CallerInfo *args)

{
  Data *pDVar1;
  QObject *pQVar2;
  int *piVar3;
  _Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false> _Var4;
  
  pDVar1 = (args->contextObject).wp.d;
  pQVar2 = (args->contextObject).wp.value;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar1->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  _Var4._M_head_impl =
       (args->slot).obj._M_t.
       super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t.
       super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
       super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  if (_Var4._M_head_impl == (QSlotObjectBase *)0x0) {
    _Var4._M_head_impl = (QSlotObjectBase *)0x0;
  }
  else {
    LOCK();
    (_Var4._M_head_impl)->m_ref = (QAtomicInt)(*(int *)&(_Var4._M_head_impl)->m_ref + 1);
    UNLOCK();
    _Var4._M_head_impl =
         (args->slot).obj._M_t.
         super___uniq_ptr_impl<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>._M_t
         .super__Tuple_impl<0UL,_QtPrivate::QSlotObjectBase_*,_QtPrivate::QSlotObjectBase::Deleter>.
         super__Head_base<0UL,_QtPrivate::QSlotObjectBase_*,_false>._M_head_impl;
  }
  piVar3 = *(int **)(this + 8);
  *(Data **)(this + 8) = pDVar1;
  *(QObject **)(this + 0x10) = pQVar2;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  piVar3 = *(int **)(this + 0x18);
  *(QSlotObjectBase **)(this + 0x18) = _Var4._M_head_impl;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      (**(code **)(piVar3 + 2))(0,piVar3,0,0,0);
      return;
    }
  }
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }